

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char sqlite3ExprAffinity(Expr *pExpr)

{
  short sVar1;
  u8 uVar2;
  char cVar3;
  ExprList *pEVar4;
  ExprList_item *pEVar5;
  
  do {
    if ((pExpr->flags & 0x42000) == 0) {
      uVar2 = pExpr->op;
      if (uVar2 == 0xb0) {
        uVar2 = pExpr->op2;
      }
      if (uVar2 == 0x8a) {
        pEVar4 = ((pExpr->x).pSelect)->pEList;
      }
      else {
        if (uVar2 != 0xb1) {
          if (uVar2 != 0xb2) {
            if (uVar2 == '$') {
              cVar3 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
              return cVar3;
            }
            if ((uVar2 == 0xa9) || (uVar2 == 0xa7)) {
              sVar1 = pExpr->iColumn;
              cVar3 = 'D';
              if ((-1 < (long)sVar1) && (sVar1 < ((pExpr->y).pTab)->nCol)) {
                return ((pExpr->y).pTab)->aCol[sVar1].affinity;
              }
            }
            else {
              cVar3 = pExpr->affExpr;
            }
            return cVar3;
          }
          pEVar5 = ((pExpr->pLeft->x).pSelect)->pEList->a + pExpr->iColumn;
          goto LAB_001978fa;
        }
        pEVar4 = (pExpr->x).pList;
      }
      pEVar5 = pEVar4->a;
    }
    else {
      pEVar5 = (ExprList_item *)&pExpr->pLeft;
    }
LAB_001978fa:
    pExpr = pEVar5->pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(const Expr *pExpr){
  int op;
  while( ExprHasProperty(pExpr, EP_Skip|EP_IfNullRow) ){
    assert( pExpr->op==TK_COLLATE
         || pExpr->op==TK_IF_NULL_ROW
         || (pExpr->op==TK_REGISTER && pExpr->op2==TK_IF_NULL_ROW) );
    pExpr = pExpr->pLeft;
    assert( pExpr!=0 );
  }
  op = pExpr->op;
  if( op==TK_REGISTER ) op = pExpr->op2;
  if( op==TK_COLUMN || op==TK_AGG_COLUMN ){
    assert( ExprUseYTab(pExpr) );
    assert( pExpr->y.pTab!=0 );
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT ){
    assert( ExprUseXSelect(pExpr) );
    assert( pExpr->x.pSelect!=0 );
    assert( pExpr->x.pSelect->pEList!=0 );
    assert( pExpr->x.pSelect->pEList->a[0].pExpr!=0 );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft!=0 && ExprUseXSelect(pExpr->pLeft) );
    assert( pExpr->iColumn < pExpr->iTable );
    assert( pExpr->iTable==pExpr->pLeft->x.pSelect->pEList->nExpr );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  if( op==TK_VECTOR ){
    assert( ExprUseXList(pExpr) );
    return sqlite3ExprAffinity(pExpr->x.pList->a[0].pExpr);
  }
  return pExpr->affExpr;
}